

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O3

void gen_spr_603(CPUPPCState_conflict2 *env)

{
  undefined8 uVar1;
  undefined8 uVar2;
  
  if ((((env->spr_cb[0x11a].name == (char *)0x0) && (env->spr[0x11a] == 0)) &&
      (env->spr_cb[0x11a].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
     (((env->spr_cb[0x11a].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
       (env->spr_cb[0x11a].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
      (env->spr_cb[0x11a].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))) {
    env->spr_cb[0x11a].name = "EAR";
    env->spr_cb[0x11a].uea_read = spr_noaccess;
    env->spr_cb[0x11a].uea_write = spr_noaccess;
    env->spr_cb[0x11a].oea_read = spr_read_generic;
    env->spr_cb[0x11a].oea_write = spr_write_generic;
    env->spr_cb[0x11a].hea_read = spr_read_generic;
    env->spr_cb[0x11a].hea_write = spr_write_generic;
    env->spr_cb[0x11a].default_value = 0;
    env->spr[0x11a] = 0;
    if (((env->spr_cb[0x3f2].name == (char *)0x0) && (env->spr[0x3f2] == 0)) &&
       ((env->spr_cb[0x3f2].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
        (((env->spr_cb[0x3f2].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
          (env->spr_cb[0x3f2].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
         (env->spr_cb[0x3f2].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))))) {
      env->spr_cb[0x3f2].name = "IABR";
      env->spr_cb[0x3f2].uea_read = spr_noaccess;
      env->spr_cb[0x3f2].uea_write = spr_noaccess;
      env->spr_cb[0x3f2].oea_read = spr_read_generic;
      env->spr_cb[0x3f2].oea_write = spr_write_generic;
      env->spr_cb[0x3f2].hea_read = spr_read_generic;
      env->spr_cb[0x3f2].hea_write = spr_write_generic;
      env->spr_cb[0x3f2].default_value = 0;
      env->spr[0x3f2] = 0;
      return;
    }
    uVar2 = 0x3f2;
    uVar1 = 0x3f2;
  }
  else {
    uVar2 = 0x11a;
    uVar1 = 0x11a;
  }
  printf("Error: Trying to register SPR %d (%03x) twice !\n",uVar2,uVar1);
  exit(1);
}

Assistant:

static void gen_spr_603(CPUPPCState *env)
{
    /* External access control */
    /* XXX : not implemented */
    spr_register(env, SPR_EAR, "EAR",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* Breakpoints */
    /* XXX : not implemented */
    spr_register(env, SPR_IABR, "IABR",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);

}